

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this,
          tag_t<cfgfile::string_trait_t> *parent,child_tags_list_t *list)

{
  bool bVar1;
  reference pptVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  input_stream_t<cfgfile::string_trait_t> *this_00;
  string_t *what;
  undefined8 in_RDX;
  tag_t<cfgfile::string_trait_t> *in_RSI;
  long in_RDI;
  tag_t<cfgfile::string_trait_t> *in_stack_00000208;
  lexeme_t<cfgfile::string_trait_t> *in_stack_00000210;
  parser_conffile_impl_t<cfgfile::string_trait_t> *in_stack_00000218;
  tag_t<cfgfile::string_trait_t> *tag;
  const_iterator __end0;
  const_iterator __begin0;
  child_tags_list_t *__range3;
  bool tag_found;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  lexical_analyzer_t<cfgfile::string_trait_t> *in_stack_00000458;
  string *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  exception_t<cfgfile::string_trait_t> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf7;
  exception_t<cfgfile::string_trait_t> local_291 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b9 [10];
  tag_t<cfgfile::string_trait_t> *local_68;
  tag_t<cfgfile::string_trait_t> **local_60;
  __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
  local_58;
  undefined8 local_50;
  byte local_41;
  lexeme_t<cfgfile::string_trait_t> local_40;
  undefined8 local_18;
  tag_t<cfgfile::string_trait_t> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(in_stack_00000458);
  local_41 = 0;
  local_50 = local_18;
  local_58._M_current =
       (tag_t<cfgfile::string_trait_t> **)
       std::
       vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
       ::begin((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                *)in_stack_fffffffffffffca8);
  local_60 = (tag_t<cfgfile::string_trait_t> **)
             std::
             vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
             ::end((vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>
                    *)in_stack_fffffffffffffca8);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffcb0,
                       (__normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
                        *)in_stack_fffffffffffffca8);
    if (!bVar1) {
LAB_00149be3:
      if ((local_41 & 1) != 0) {
        lexeme_t<cfgfile::string_trait_t>::~lexeme_t((lexeme_t<cfgfile::string_trait_t> *)0x14a20b);
        return;
      }
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x30);
      __lhs = local_1b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),(char *)__lhs,
                 (allocator<char> *)__rhs);
      string_trait_t::from_ascii(in_stack_fffffffffffffca8);
      tag_t<cfgfile::string_trait_t>::name_abi_cxx11_(local_10);
      std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),(char *)__lhs,
                 (allocator<char> *)__rhs);
      string_trait_t::from_ascii(in_stack_fffffffffffffca8);
      std::operator+(__lhs,__rhs);
      lexeme_t<cfgfile::string_trait_t>::value_abi_cxx11_(&local_40);
      std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),(char *)__lhs,
                 (allocator<char> *)__rhs);
      string_trait_t::from_ascii(in_stack_fffffffffffffca8);
      std::operator+(__lhs,__rhs);
      this_00 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                          ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
      input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(this_00);
      std::operator+(in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
      this_01 = local_291;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),(char *)__lhs,
                 (allocator<char> *)__rhs);
      string_trait_t::from_ascii(in_stack_fffffffffffffca8);
      std::operator+(__lhs,__rhs);
      what = (string_t *)
             lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                       ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
      string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffffca8);
      std::operator+(__lhs,__rhs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcf7,in_stack_fffffffffffffcf0),(char *)__lhs,
                 (allocator<char> *)__rhs);
      string_trait_t::from_ascii(in_stack_fffffffffffffca8);
      std::operator+(__lhs,__rhs);
      exception_t<cfgfile::string_trait_t>::exception_t(this_01,what);
      __cxa_throw(__rhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    pptVar2 = __gnu_cxx::
              __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
              ::operator*(&local_58);
    local_68 = *pptVar2;
    in_stack_fffffffffffffcf7 =
         start_tag_parsing(in_stack_00000218,in_stack_00000210,in_stack_00000208);
    if ((bool)in_stack_fffffffffffffcf7) {
      local_41 = 1;
      goto LAB_00149be3;
    }
    __gnu_cxx::
    __normal_iterator<cfgfile::tag_t<cfgfile::string_trait_t>_*const_*,_std::vector<cfgfile::tag_t<cfgfile::string_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::string_trait_t>_*>_>_>
    ::operator++(&local_58);
  } while( true );
}

Assistant:

void start_tag_parsing( const tag_t< Trait > & parent,
		const typename tag_t< Trait >::child_tags_list_t & list )
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		bool tag_found = false;

		for( tag_t< Trait > * tag : list )
		{
			if( start_tag_parsing( lexeme, *tag ) )
			{
				tag_found = true;

				break;
			}
		}

		if( !tag_found )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected one child tag of tag \"" ) +
				parent.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
	}